

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O2

string * __thiscall
m2d::savanna::url::to_string_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)this);
  std::operator+(&bStack_78,&local_58,"://");
  std::__cxx11::string::string((string *)&local_38,(string *)&this->host_);
  std::operator+(__return_storage_ptr__,&bStack_78,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator!=(&this->port_,"");
  if (bVar1) {
    port_str_abi_cxx11_(&local_58,this);
    std::operator+(&bStack_78,":",&local_58);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string((string *)&bStack_78,(string *)&this->path_);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&bStack_78);
  bVar1 = std::operator!=(&this->query_,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,(string *)&this->query_);
    std::operator+(&bStack_78,"?",&local_58);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = std::operator!=(&this->fragment_,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,(string *)&this->fragment_);
    std::operator+(&bStack_78,"#",&local_58);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string()
		{
			std::string str = scheme() + "://" + host();
			if (port_ != "") {
				str += ":" + port_str();
			}
			str += path();

			if (query_ != "") {
				str += "?" + query();
			}
			if (fragment_ != "") {
				str += "#" + fragment();
			}
			return str;
		}